

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrinsic_geometry_interface.cpp
# Opt level: O1

void __thiscall
geometrycentral::surface::ExtrinsicGeometryInterface::computeFacePrincipalCurvatureDirections
          (ExtrinsicGeometryInterface *this)

{
  Vector2 *pVVar1;
  Vector2 VVar2;
  bool bVar3;
  SurfaceMesh *pSVar4;
  size_t sVar5;
  pointer puVar6;
  pointer puVar7;
  double *pdVar8;
  double *pdVar9;
  Vector2 *pVVar10;
  Vector2 *pVVar11;
  unsigned_long uVar12;
  undefined1 auVar13 [16];
  long lVar14;
  size_t i_1;
  size_t sVar15;
  size_t sVar16;
  ulong uVar17;
  unsigned_long uVar18;
  size_t i;
  unsigned_long uVar19;
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector2> local_70;
  
  if ((this->super_IntrinsicGeometryInterface).edgeLengthsQ.super_DependentQuantity.computed ==
      false) {
    if ((this->super_IntrinsicGeometryInterface).edgeLengthsQ.super_DependentQuantity.evaluateFunc.
        super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_001b07fc;
    (*(this->super_IntrinsicGeometryInterface).edgeLengthsQ.super_DependentQuantity.evaluateFunc.
      _M_invoker)((_Any_data *)
                  &(this->super_IntrinsicGeometryInterface).edgeLengthsQ.super_DependentQuantity.
                   evaluateFunc);
    (this->super_IntrinsicGeometryInterface).edgeLengthsQ.super_DependentQuantity.computed = true;
  }
  if ((this->super_IntrinsicGeometryInterface).halfedgeVectorsInFaceQ.super_DependentQuantity.
      computed == false) {
    if ((this->super_IntrinsicGeometryInterface).halfedgeVectorsInFaceQ.super_DependentQuantity.
        evaluateFunc.super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_001b07fc;
    (*(this->super_IntrinsicGeometryInterface).halfedgeVectorsInFaceQ.super_DependentQuantity.
      evaluateFunc._M_invoker)
              ((_Any_data *)
               &(this->super_IntrinsicGeometryInterface).halfedgeVectorsInFaceQ.
                super_DependentQuantity.evaluateFunc);
    (this->super_IntrinsicGeometryInterface).halfedgeVectorsInFaceQ.super_DependentQuantity.computed
         = true;
  }
  if ((this->edgeDihedralAnglesQ).super_DependentQuantity.computed == false) {
    if ((this->edgeDihedralAnglesQ).super_DependentQuantity.evaluateFunc.super__Function_base.
        _M_manager == (_Manager_type)0x0) {
LAB_001b07fc:
      ::std::__throw_bad_function_call();
    }
    (*(this->edgeDihedralAnglesQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->edgeDihedralAnglesQ).super_DependentQuantity.evaluateFunc);
    (this->edgeDihedralAnglesQ).super_DependentQuantity.computed = true;
  }
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector2>::MeshData
            (&local_70,(this->super_IntrinsicGeometryInterface).super_BaseGeometryInterface.mesh);
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector2>::operator=
            (&this->facePrincipalCurvatureDirections,&local_70);
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector2>::~MeshData(&local_70);
  pSVar4 = (this->super_IntrinsicGeometryInterface).super_BaseGeometryInterface.mesh;
  sVar5 = pSVar4->nFacesFillCount;
  if ((sVar5 == 0) ||
     (puVar6 = (pSVar4->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start, *puVar6 != 0xffffffffffffffff)) {
    sVar15 = 0;
  }
  else {
    sVar16 = 0;
    do {
      sVar15 = sVar5;
      if (sVar5 - 1 == sVar16) break;
      sVar15 = sVar16 + 1;
      lVar14 = sVar16 + 1;
      sVar16 = sVar15;
    } while (puVar6[lVar14] == 0xffffffffffffffff);
  }
  if (sVar15 != sVar5) {
    puVar6 = (pSVar4->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar7 = (pSVar4->fHalfedgeArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar3 = pSVar4->useImplicitTwinFlag;
    pdVar8 = (this->super_IntrinsicGeometryInterface).edgeLengths.data.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    pdVar9 = (this->edgeDihedralAngles).data.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    pVVar10 = (this->super_IntrinsicGeometryInterface).halfedgeVectorsInFace.data.
              super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
    pVVar11 = (this->facePrincipalCurvatureDirections).data.
              super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
    do {
      uVar12 = puVar7[sVar15];
      dVar21 = 0.0;
      dVar22 = 0.0;
      uVar19 = uVar12;
      do {
        if (bVar3 == false) {
          uVar18 = (pSVar4->heEdgeArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar19];
          uVar17 = (pSVar4->heEdgeArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar19];
        }
        else {
          uVar18 = uVar19 >> 1;
          uVar17 = uVar19 >> 1;
        }
        dVar23 = 1.0 / pdVar8[uVar18];
        VVar2 = pVVar10[uVar19];
        auVar25._0_8_ = -pVVar10[uVar19].y;
        auVar25._8_8_ = 0x8000000000000000;
        auVar20 = vshufpd_avx((undefined1  [16])VVar2,auVar25,1);
        auVar13 = vshufpd_avx((undefined1  [16])VVar2,(undefined1  [16])VVar2,1);
        auVar26._0_8_ = auVar13._0_8_ * auVar20._0_8_;
        auVar26._8_8_ = auVar13._8_8_ * auVar20._8_8_;
        auVar20._8_8_ = pVVar10[uVar19].x;
        auVar20._0_8_ = pVVar10[uVar19].x;
        auVar20 = vfnmadd231pd_avx512vl(auVar26,(undefined1  [16])VVar2,auVar20);
        auVar24._0_8_ = dVar23 * auVar20._0_8_;
        auVar24._8_8_ = dVar23 * auVar20._8_8_;
        dVar23 = pdVar9[uVar17];
        auVar13._8_8_ = dVar23;
        auVar13._0_8_ = dVar23;
        auVar20 = vmulpd_avx512vl(auVar24,auVar13);
        dVar21 = dVar21 + auVar20._0_8_;
        dVar22 = dVar22 + auVar20._8_8_;
        uVar19 = puVar6[uVar19];
      } while (uVar19 != uVar12);
      pVVar1 = pVVar11 + sVar15;
      pVVar1->x = dVar21 * 0.25;
      pVVar1->y = dVar22 * 0.25;
      sVar16 = sVar15;
      do {
        sVar15 = sVar5;
        if (sVar5 - 1 == sVar16) break;
        sVar15 = sVar16 + 1;
        lVar14 = sVar16 + 1;
        sVar16 = sVar15;
      } while (puVar7[lVar14] == 0xffffffffffffffff);
    } while (sVar15 != sVar5);
  }
  return;
}

Assistant:

void ExtrinsicGeometryInterface::computeFacePrincipalCurvatureDirections() {
  edgeLengthsQ.ensureHave();
  halfedgeVectorsInFaceQ.ensureHave();
  edgeDihedralAnglesQ.ensureHave();

  facePrincipalCurvatureDirections = FaceData<Vector2>(mesh);

  for (Face f : mesh.faces()) {
    Vector2 principalDir{0.0, 0.0};
    for (Halfedge he : f.adjacentHalfedges()) {
      double len = edgeLengths[he.edge()];
      double alpha = edgeDihedralAngles[he.edge()];
      Vector2 vec = halfedgeVectorsInFace[he];
      principalDir += -vec * vec / len * alpha;
    }

    facePrincipalCurvatureDirections[f] = principalDir / 4;
  }
}